

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseClicked(int button,bool repeat)

{
  float __y;
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  
  pIVar1 = GImGui;
  fVar3 = (GImGui->IO).MouseDownDuration[button];
  bVar2 = true;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    if ((repeat) && (fVar4 = (GImGui->IO).KeyRepeatDelay, fVar4 < fVar3)) {
      __y = (GImGui->IO).KeyRepeatRate;
      fVar3 = fVar3 - fVar4;
      fVar4 = fmodf(fVar3,__y);
      fVar3 = fmodf(fVar3 - (pIVar1->IO).DeltaTime,__y);
      if (__y * 0.5 < fVar4 == fVar3 <= __y * 0.5) {
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsMouseClicked(int button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        float delay = g.IO.KeyRepeatDelay, rate = g.IO.KeyRepeatRate;
        if ((ImFmod(t - delay, rate) > rate*0.5f) != (ImFmod(t - delay - g.IO.DeltaTime, rate) > rate*0.5f))
            return true;
    }

    return false;
}